

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  long lVar1;
  unsigned_long uVar2;
  char *pcVar3;
  ulong uVar4;
  thread *ptVar5;
  char **ppcVar6;
  char *in_stack_00000208;
  char *in_stack_00000210;
  char *in_stack_00000218;
  Database *in_stack_00000220;
  size_t *in_stack_fffffffffffffd78;
  string *in_stack_fffffffffffffd80;
  thread *local_278;
  char **local_258;
  thread *local_250 [3];
  ulong local_238;
  thread *local_230;
  uint *local_228;
  uint local_21c;
  char *local_218;
  allocator *local_210;
  undefined1 *local_208;
  char **local_200;
  char **r;
  char **__end1_1;
  char **__begin1_1;
  char___0_ *__range1_1;
  thread *t;
  thread *__end1;
  thread *__begin1;
  thread (*__range1) [19660];
  uint *local_1b8;
  uint *local_1b0;
  atomic<unsigned_char> *local_1a8;
  ulong local_1a0;
  char **local_198;
  undefined1 *local_190;
  int local_17c;
  ulong uStack_178;
  int i;
  unsigned_long __vla_expr1;
  unsigned_long __vla_expr0;
  uint local_160;
  allocator local_159;
  int thread_num;
  uint local_138 [2];
  int round;
  undefined1 local_128 [8];
  Database tpch;
  char **argv_local;
  int argc_local;
  
  tpch._264_8_ = argv;
  pcVar3 = (char *)std::__cxx11::string::c_str();
  mkdir(pcVar3,0x1ff);
  local_208 = local_128;
  Database::Database((Database *)0x104465);
  Database::importDB(in_stack_00000220,in_stack_00000218,in_stack_00000210,in_stack_00000208);
  local_218 = *(char **)(tpch._264_8_ + 0x20);
  local_210 = &local_159;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&thread_num,local_218,local_210);
  local_21c = std::__cxx11::stoi(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,0);
  std::__cxx11::string::~string((string *)&thread_num);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  local_138[0] = local_21c;
  local_228 = (uint *)std::min<int>(&MAX_CORE_NUM,(int *)local_138);
  local_160 = *local_228;
  local_238 = (ulong)*local_228;
  __vla_expr0 = (unsigned_long)&stack0xfffffffffffffd78;
  lVar1 = -(local_238 * 8 + 0xf & 0xfffffffffffffff0);
  ptVar5 = (thread *)(&stack0xfffffffffffffd78 + lVar1);
  local_230 = ptVar5;
  __vla_expr1 = local_238;
  if (local_238 != 0) {
    local_250[1] = ptVar5 + local_238;
    local_250[2] = ptVar5;
    do {
      local_250[0] = local_250[2];
      *(undefined8 *)(&stack0xfffffffffffffd70 + lVar1) = 0x1045a6;
      std::thread::thread(*(thread **)(&stack0xfffffffffffffd70 + lVar1));
      local_250[2] = local_250[0] + 1;
    } while (local_250[0] + 1 != local_250[1]);
  }
  uVar4 = (ulong)local_138[0];
  ppcVar6 = (char **)((long)ptVar5 - (uVar4 * 8 + 0xf & 0xfffffffffffffff0));
  local_258 = ppcVar6;
  uStack_178 = uVar4;
  for (local_17c = 0; local_17c < (int)local_160; local_17c = local_17c + 1) {
    __range1._0_4_ = local_17c;
    local_1b8 = local_138;
    local_1b0 = &local_160;
    local_1a8 = &tpch.pending;
    local_1a0 = uVar4;
    local_198 = local_258;
    local_190 = local_128;
    ppcVar6[-1] = (char *)0x104680;
    std::thread::thread<main::__0,,void>((thread *)ppcVar6[7],(type *)ppcVar6[6]);
    ppcVar6[-1] = (char *)0x1046a3;
    std::thread::operator=((thread *)ppcVar6[1],(thread *)*ppcVar6);
    ppcVar6[-1] = (char *)0x1046af;
    std::thread::~thread((thread *)ppcVar6[-1]);
  }
  __begin1 = local_230;
  t = local_230 + local_238;
  for (__end1 = local_230; __end1 != t; __end1 = __end1 + 1) {
    __range1_1 = (char___0_ *)__end1;
    ppcVar6[-1] = (char *)0x1047d5;
    std::thread::join();
  }
  __begin1_1 = local_258;
  r = local_258 + uVar4;
  for (__end1_1 = local_258; __end1_1 != r; __end1_1 = __end1_1 + 1) {
    local_200 = __end1_1;
    pcVar3 = *__end1_1;
    ppcVar6[-1] = (char *)0x104863;
    printf("%s",pcVar3);
  }
  local_278 = local_230 + local_238;
  if (local_230 != local_278) {
    do {
      local_278 = local_278 + -1;
      ppcVar6[-1] = (char *)0x1048bd;
      std::thread::~thread((thread *)ppcVar6[-1]);
    } while (local_278 != local_230);
  }
  uVar2 = __vla_expr0;
  *(undefined8 *)(__vla_expr0 - 8) = 0x1048ed;
  Database::~Database(*(Database **)(uVar2 + 0x20));
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {

  mkdir(DATA_PATH.c_str(), 0777);

  Database tpch;

  // load
  tpch.importDB(argv[1], argv[2], argv[3]);

  auto round = std::stoi(argv[4]);
  auto thread_num = std::min(MAX_CORE_NUM, round);
  std::thread threads[thread_num];
  char* results[round];

  // query
  for (int i = 0; i < thread_num; i++) {
    threads[i] = std::thread([&, i]{
      for (int round_id = i; round_id < round; round_id += thread_num) {
        auto mktsegmentCondition = argv[5 + round_id * 4][0];
        auto orderdateCondition = util::DateToInt(argv[5 + round_id * 4 + 1]);
        auto shipdateCondition = util::DateToInt(argv[5 + round_id * 4 + 2]);
        auto topn = std::stoi(argv[5 + round_id * 4 + 3]);
        results[round_id] = tpch.query(mktsegmentCondition, orderdateCondition, shipdateCondition, topn);
      }
    });
  }

  for (auto &t : threads) {
    t.join();
  }

  for (auto &r : results) {
    printf("%s", r);
  }

  return 0;
}